

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_close(quicly_conn_t *conn,int err,char *reason_phrase)

{
  int iVar1;
  uint64_t in_RDX;
  uint in_ESI;
  quicly_conn_t *in_RDI;
  int ret;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((((in_ESI != 0) && ((in_ESI & 0xffff0000) != 0x30000)) && (in_ESI != 0x201)) &&
     (in_ESI != 0xff07)) {
    __assert_fail("err == 0 || QUICLY_ERROR_IS_QUIC_APPLICATION(err) || QUICLY_ERROR_IS_CONCEALED(err)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x120f,"int quicly_close(quicly_conn_t *, int, const char *)");
  }
  lock_now((quicly_conn_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  iVar1 = initiate_close(in_RDI,in_ESI,in_RDX,
                         (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  unlock_now((quicly_conn_t *)0x13a782);
  return iVar1;
}

Assistant:

int quicly_close(quicly_conn_t *conn, int err, const char *reason_phrase)
{
    int ret;

    assert(err == 0 || QUICLY_ERROR_IS_QUIC_APPLICATION(err) || QUICLY_ERROR_IS_CONCEALED(err));

    lock_now(conn, 1);
    ret = initiate_close(conn, err, QUICLY_FRAME_TYPE_PADDING /* used when err == 0 */, reason_phrase);
    unlock_now(conn);

    return ret;
}